

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::ScaleParameter::ScaleParameter(ScaleParameter *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ScaleParameter_0071e900;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  if (this != (ScaleParameter *)&_ScaleParameter_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&this->filler_ + 4) = 0;
  *(undefined8 *)((long)&this->bias_filler_ + 1) = 0;
  this->axis_ = 1;
  this->num_axes_ = 1;
  return;
}

Assistant:

ScaleParameter::ScaleParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.ScaleParameter)
}